

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::has_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  ulong uVar3;
  bool bVar4;
  key_type_conflict local_14;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)type);
  if ((pMVar2 == (Meta *)0x0) ||
     (uVar3 = (ulong)index,
     (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= uVar3)) {
    bVar4 = false;
  }
  else {
    pDVar1 = (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    if (decoration < 0x40) {
      uVar3 = 1L << ((byte)decoration & 0x3f) & pDVar1[uVar3].extended.flags.lower;
    }
    else {
      uVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&pDVar1[uVar3].extended.flags.higher._M_h,&local_14);
    }
    bVar4 = uVar3 != 0;
  }
  return bVar4;
}

Assistant:

bool Compiler::has_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return false;

	if (index >= m->members.size())
		return false;

	auto &dec = m->members[index];
	return dec.extended.flags.get(decoration);
}